

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O3

_Bool project_p(source origin,wchar_t r,loc grid,wchar_t dam,wchar_t typ,wchar_t power,_Bool self)

{
  short sVar1;
  project_player_handler_f p_Var2;
  player *p;
  _Bool _Var3;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t wVar6;
  monster_conflict *mon;
  object *poVar7;
  int iVar8;
  char *fmt;
  int iVar9;
  anon_union_8_5_62f3dbed_for_which obj;
  char *pcVar10;
  trap *trap;
  int iVar11;
  char killer [80];
  project_player_handler_context_t local_b8;
  char local_88 [88];
  
  obj = origin.which;
  sVar1 = player->timed[2];
  p_Var2 = player_handlers[typ];
  local_b8.power = power;
  local_b8.obvious = true;
  local_b8.origin.what = origin.what;
  local_b8.origin.which = obj;
  local_b8.r = r;
  local_b8.grid = grid;
  local_b8.dam = dam;
  local_b8.type = typ;
  _Var3 = square_isdecoyed(cave,grid);
  if (dam != L'\0' && _Var3) {
    square_destroy_decoy(cave,grid);
  }
  _Var3 = square_isplayer(cave,grid);
  if (!_Var3) {
    return false;
  }
  _Var3 = square_isprotect(cave,grid);
  if (_Var3) {
    _Var3 = square_isrubble(cave,grid);
    if ((_Var3) && (uVar5 = Rand_div(10), uVar5 == 0)) {
      pcVar10 = "You duck behind a boulder!";
LAB_001c7e25:
      msg(pcVar10);
      return false;
    }
    _Var3 = square_istree(cave,grid);
    if (((_Var3) && (uVar5 = Rand_div(8), uVar5 == 0)) &&
       ((_Var3 = flag_has_dbg((player->state).pflags,10,0x30,"player->state.pflags","(PF_WOODSMAN)")
        , _Var3 ||
        (_Var3 = flag_has_dbg((player->state).pflags,10,0x16,"player->state.pflags","(PF_ELVEN)"),
        _Var3)))) {
      pcVar10 = "You dodge behind a tree!";
      goto LAB_001c7e25;
    }
  }
  switch(origin.what) {
  case SRC_NONE:
  case SRC_GRID:
    pcVar10 = "a bug";
    goto LAB_001c7acb;
  case SRC_TRAP:
    pcVar10 = ((ego_item *)(obj.trap)->kind)->text;
    fmt = "a %s";
    goto LAB_001c7b35;
  case SRC_PLAYER:
    if (!self) {
      return false;
    }
    pcVar10 = "yourself";
LAB_001c7acb:
    my_strcpy(local_88,pcVar10,0x50);
    break;
  case SRC_MONSTER:
    mon = (monster_conflict *)cave_monster(cave,origin.which._0_4_);
    _Var3 = monster_is_visible((monster *)mon);
    monster_desc(local_88,0x50,(monster *)mon,L'\x88');
    update_smart_learn(mon,player,L'\0',L'\0',typ);
    p = player;
    if (mon != (monster_conflict *)0x0 && typ == L'\x1b') {
      iVar9 = (player->state).to_a + (player->state).ac;
      wVar6 = slot_by_name(player,"arm");
      poVar7 = slot_object(p,wVar6);
      iVar11 = 0;
      if (poVar7 != (object *)0x0) {
        iVar11 = (int)poVar7->ac;
      }
      iVar8 = 0;
      if ((player->state).shield_on_back == false) {
        _Var4 = flag_has_dbg((player->state).pflags,10,0x33,"player->state.pflags",
                             "(PF_SHIELD_MAST)");
        iVar8 = iVar11 + 3;
        if (!_Var4) {
          iVar8 = iVar11;
        }
      }
      wVar6 = Rand_div(0x50);
      if (wVar6 < (player->state).evasion_chance) {
        msg("You evade the missile!");
        disturb(player);
        return true;
      }
      iVar11 = 0x96;
      if (iVar9 < 0x96) {
        iVar11 = iVar9;
      }
      uVar5 = Rand_div(mon->race->level * 0x14 + 200);
      if ((int)(uVar5 + 1) < iVar11) {
        pcVar10 = "The missile glances off your armour.";
      }
      else {
        uVar5 = Rand_div(0x78);
        if (iVar8 <= (int)uVar5) goto LAB_001c7ea0;
        pcVar10 = "The missile ricochets off your shield.";
      }
      msg(pcVar10);
    }
LAB_001c7ea0:
    if (_Var3 && sVar1 == 0) goto LAB_001c7b7a;
    goto LAB_001c7b59;
  case SRC_OBJECT:
    object_desc(local_88,0x50,obj.object,0x40,player);
    break;
  case SRC_CHEST_TRAP:
    pcVar10 = (obj.chest_trap)->msg_death;
    fmt = "%s";
LAB_001c7b35:
    strnfmt(local_88,0x50,fmt,pcVar10);
  }
  if (sVar1 != 0) {
LAB_001c7b59:
    msg("You are hit by %s!");
  }
LAB_001c7b7a:
  wVar6 = terrain_adjust_dam(player,(monster_conflict *)0x0,typ,dam);
  local_b8.dam = adjust_dam(player,typ,wVar6,true);
  if (local_b8.dam != L'\0') {
    if (self) {
      local_b8.dam = local_b8.dam / 10;
    }
    wVar6 = player_apply_damage_reduction(player,local_b8.dam);
    if ((L'\0' < wVar6) && ((player->opts).opt[3] == true)) {
      msg("You take %d damage.",(ulong)(uint)wVar6);
    }
    take_hit(player,wVar6,local_88);
  }
  if ((typ != L'>') && (player->is_dead == false)) {
    wVar6 = (*p_Var2)(&local_b8);
    wVar6 = player_apply_damage_reduction(player,wVar6);
    if ((L'\0' < wVar6) && ((player->opts).opt[3] == true)) {
      msg("You take an extra %d damage.",(ulong)(uint)wVar6);
    }
    take_hit(player,wVar6,local_88);
  }
  disturb(player);
  return local_b8.obvious;
}

Assistant:

bool project_p(struct source origin, int r, struct loc grid, int dam, int typ,
			   int power, bool self)
{
	bool blind = (player->timed[TMD_BLIND] ? true : false);
	bool seen = !blind;
	bool obvious = true;
	struct monster *mon = NULL;

	/* Monster or trap name (for damage) */
	char killer[80];

	project_player_handler_f player_handler = player_handlers[typ];
	project_player_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		power,
		obvious
	};

	/* Decoy has been hit */
	if (square_isdecoyed(cave, grid) && context.dam) {
		square_destroy_decoy(cave, grid);
	}

	/* No player here */
	if (!square_isplayer(cave, grid)) {
		return false;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		/* A player behind rubble can duck. */
		if (square_isrubble(cave, grid) && one_in_(10)) {
			msg("You duck behind a boulder!");
			return false;
		}

		/* Rangers, elves and druids can take cover in trees. */
		if (square_istree(cave, grid) && one_in_(8) &&
			(player_has(player, PF_WOODSMAN) || player_has(player, PF_ELVEN))) {
			msg("You dodge behind a tree!");
			return false;
		}
	}

	switch (origin.what) {
		case SRC_PLAYER: {
			/* Don't affect projector unless explicitly allowed */
			if (!self) return false;
			/* Use the same message as the DAMAGE handler. */
			my_strcpy(killer, "yourself", sizeof(killer));
			break;
		}

		case SRC_MONSTER: {
			mon = cave_monster(cave, origin.which.monster);

			/* Check it is visible */
			if (!monster_is_visible(mon))
				seen = false;

			/* Get the monster's real name */
			monster_desc(killer, sizeof(killer), mon, MDESC_DIED_FROM);

			/* Monster sees what is going on */
			update_smart_learn(mon, player, 0, 0, typ);

			break;
		}

		case SRC_TRAP: {
			struct trap *trap = origin.which.trap;

			/* Get the trap name */
			strnfmt(killer, sizeof(killer), "a %s", trap->kind->desc);

			break;
		}

		case SRC_OBJECT: {
			struct object *obj = origin.which.object;
			object_desc(killer, sizeof(killer), obj,
				ODESC_PREFIX | ODESC_BASE, player);
			break;
		}

		case SRC_CHEST_TRAP: {
			struct chest_trap *trap = origin.which.chest_trap;

			/* Get the trap name */
			strnfmt(killer, sizeof(killer), "%s", trap->msg_death);

			break;
		}

		case SRC_GRID:
		case SRC_NONE: {
			/* Use the same message as the DAMAGE handler. */
			my_strcpy(killer, "a bug", sizeof(killer));
			break;
		}
		default: break;
	}

	/* Try to evade or deflect missiles */
	if ((typ == ELEM_ARROW) && mon) {
		/* Get effective armor values */
		int armor = player->state.ac + player->state.to_a;
		struct object *shld = slot_object(player, slot_by_name(player, "arm"));
		int shield_ac = shld ? shld->ac : 0;
		if (player->state.shield_on_back) {
			shield_ac = 0;
		} else if (player_has(player, PF_SHIELD_MAST)) {
			shield_ac += 3;
		}

		if (randint1(80) <= player->state.evasion_chance) {
			/* Evasion */
			msg("You evade the missile!");
			disturb(player);
			return true;
		} else if (MIN(armor, 150) > randint1((10 + mon->race->level) * 20)) {
			/* Armor deflection */
			msg("The missile glances off your armour.");
		} else if (shield_ac > randint0(20 * 6)) {
			/* Shield deflection (20 is max shield AC) */
			msg("The missile ricochets off your shield.");
		}
	}

	/* Let player know what is going on */
	if (!seen) {
		msg("You are hit by %s!", projections[typ].blind_desc);
	}

	/* Adjust damage for terrain and element properties, and apply it */
	context.dam = terrain_adjust_dam(player, NULL, typ, context.dam);
	context.dam = adjust_dam(player, typ, context.dam, true);
	if (context.dam) {
		int reduced;

		/* Self-inflicted damage is scaled down */
		if (self) {
			context.dam /= 10;
		}
		/*
		 * Account for the player's damage reduction.   That does not
		 * affect the side effects (i.e. player_handler), so leave
		 * context.dam unmodified.
		 */
		reduced = player_apply_damage_reduction(player, context.dam);
		if (reduced > 0 && OPT(player, show_damage)) {
			msg("You take %d damage.", reduced);
		}
		take_hit(player, reduced, killer);
	}

	/* Handle side effects, possibly including extra damage */
	if (player_handler != NULL && player->is_dead == false) {
		int xtra = player_handler(&context);

		xtra = player_apply_damage_reduction(player, xtra);
		if (xtra > 0 && OPT(player, show_damage)) {
			msg("You take an extra %d damage.", xtra);
		}
		take_hit(player, xtra, killer);
	}

	/* Disturb */
	disturb(player);

	/* Return "Anything seen?" */
	return context.obvious;
}